

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

bool __thiscall Am_Value::operator!=(Am_Value *this,Am_Generic_Procedure *test_value)

{
  Am_ID_Tag AVar1;
  uint uVar2;
  bool local_31;
  bool local_29;
  Am_Generic_Procedure *test_value_local;
  Am_Value *this_local;
  
  AVar1 = Am_Type_Class(this->type);
  if (AVar1 == 0x3000) {
    local_29 = (this->value).wrapper_value != (Am_Wrapper *)0x0 ||
               test_value != (Am_Generic_Procedure *)0x0;
    this_local._7_1_ = local_29;
  }
  else {
    uVar2 = (uint)this->type;
    if ((uVar2 - 2 < 2) || (uVar2 == 9)) {
      local_31 = (this->value).wrapper_value != (Am_Wrapper *)0x0 ||
                 test_value != (Am_Generic_Procedure *)0x0;
      this_local._7_1_ = local_31;
    }
    else if (uVar2 == 10) {
      this_local._7_1_ = (this->value).wrapper_value != (Am_Wrapper *)test_value;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
Am_Value::operator!=(Am_Generic_Procedure *test_value) const
{
  if (Am_Type_Class(type) == Am_METHOD)
    return value.voidptr_value || test_value;
  switch (type) {
  case Am_PROC:
    return value.proc_value != test_value;
  case Am_INT:
  case Am_LONG:
  case Am_VOIDPTR:
    return value.voidptr_value || test_value;
  default:
    return true;
  }
}